

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

MockSpec<BasicTestLinearExprBuilder<0>_(int)> * __thiscall
testing::internal::FunctionMocker<BasicTestLinearExprBuilder<0>_(int)>::With
          (FunctionMocker<BasicTestLinearExprBuilder<0>_(int)> *this,Matcher<int> *m1)

{
  linked_ptr_internal lVar1;
  linked_ptr<const_testing::MatcherInterface<int>_> local_28;
  
  local_28.value_ = (m1->super_MatcherBase<int>).impl_.value_;
  lVar1.next_ = &local_28.link_;
  if (local_28.value_ != (MatcherInterface<int> *)0x0) {
    linked_ptr_internal::join(&local_28.link_,&(m1->super_MatcherBase<int>).impl_.link_);
    lVar1.next_ = local_28.link_.next_;
  }
  local_28.link_.next_ = lVar1.next_;
  linked_ptr<const_testing::MatcherInterface<int>_>::operator=
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&(this->super_FunctionMockerBase<BasicTestLinearExprBuilder<0>_(int)>).
                     current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
                     super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.
                     super_MatcherBase<int> + 8),&local_28);
  linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr(&local_28);
  return &(this->super_FunctionMockerBase<BasicTestLinearExprBuilder<0>_(int)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }